

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

btScalar __thiscall btLCP::AiN_times_qN(btLCP *this,int i,btScalar *q)

{
  btScalar bVar1;
  
  bVar1 = btLargeDot(this->m_A[i] + this->m_nC,q + this->m_nC,this->m_nN);
  return bVar1;
}

Assistant:

btScalar AiN_times_qN (int i, btScalar *q) const { return btLargeDot (BTAROW(i)+m_nC, q+m_nC, m_nN); }